

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O3

void hyb_gga_xc_hjs_init(xc_func_type *p)

{
  int iVar1;
  
  iVar1 = p->info->number;
  if (iVar1 - 0x1adU < 4) {
    hyb_gga_xc_hjs_init::funcs_id[0] = iVar1 + 0x60;
    hyb_gga_xc_hjs_init::funcs_id[1] = hyb_gga_xc_hjs_init::funcs_id[0];
    xc_mix_init(p,3,hyb_gga_xc_hjs_init::funcs_id,hyb_gga_xc_hjs_init::funcs_coef);
    xc_hyb_init_sr(p,0.25,0.11);
    xc_func_set_ext_params_name(*p->func_aux,"_omega",0.0);
    xc_func_set_ext_params_name(p->func_aux[1],"_omega",p->cam_omega);
    return;
  }
  hyb_gga_xc_hjs_init_cold_1();
  xc_mix_init(p,2,xc_hyb_gga_xc_lc_blyp_init::funcs_id,xc_hyb_gga_xc_lc_blyp_init::funcs_coef);
  xc_hyb_init_cam(p,0.0,0.0,0.0);
  return;
}

Assistant:

static void
hyb_gga_xc_hjs_init(xc_func_type *p)
{
  static int   funcs_id  [3] = {-1, -1, XC_GGA_C_PBE};
  static double funcs_coef[3] = {1.0, -0.25, 1.0};

  switch(p->info->number){
  case XC_HYB_GGA_XC_HJS_PBE:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_PBE;
    break;
  case XC_HYB_GGA_XC_HJS_PBE_SOL:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_PBE_SOL;
    break;
  case XC_HYB_GGA_XC_HJS_B88:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_B88;
    break;
  case XC_HYB_GGA_XC_HJS_B97X:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_B97X;
    break;
  default:
    fprintf(stderr, "Internal error in hyb_gga_xc_hjs\n");
    exit(1);
  }

  xc_mix_init(p, 3, funcs_id, funcs_coef);
  xc_hyb_init_sr(p, 0.25, 0.11);

  xc_func_set_ext_params_name(p->func_aux[0], "_omega", 0.0);
  xc_func_set_ext_params_name(p->func_aux[1], "_omega", p->cam_omega);
}